

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Modf::doApply
          (IRet *__return_storage_ptr__,Modf *this,EvalContext *param_1,IArgs *iargs)

{
  Interval *pIVar1;
  undefined8 *puVar2;
  double *pdVar3;
  bool bVar4;
  deBool dVar5;
  float fVar6;
  double dVar7;
  Interval local_1f8;
  Interval local_1e0;
  Interval local_1c8;
  Interval local_1b0;
  undefined8 *local_198;
  Interval *whole_1;
  double x_3;
  double local_180;
  double local_178;
  double *local_170;
  Interval *whole;
  double x_2;
  double local_158;
  double local_150;
  undefined1 local_148 [8];
  Interval whole_hi_;
  Interval whole_lo_;
  Interval *whole_dst_;
  Interval *whole_arg_;
  Interval local_f0;
  Interval local_d8;
  undefined8 *local_c0;
  Interval *frac_1;
  double x_1;
  double local_a8;
  double local_a0;
  double *local_98;
  Interval *frac;
  double x;
  double local_80;
  double local_78;
  undefined1 local_70 [8];
  Interval frac_hi_;
  Interval frac_lo_;
  Interval *frac_dst_;
  Interval *frac_arg_;
  double intPart;
  Interval *wholeIV;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  Modf *this_local;
  
  wholeIV = (Interval *)iargs;
  iargs_local = (IArgs *)param_1;
  param_1_local = (EvalContext *)this;
  tcu::Interval::Interval(__return_storage_ptr__);
  intPart = wholeIV->m_lo;
  frac_arg_ = (Interval *)0x0;
  do {
    pIVar1 = *(Interval **)wholeIV;
    tcu::Interval::Interval((Interval *)&frac_hi_.m_hi);
    tcu::Interval::Interval((Interval *)local_70);
    bVar4 = tcu::Interval::empty(pIVar1);
    if (bVar4) {
      tcu::Interval::Interval((Interval *)&x);
      *(double *)__return_storage_ptr__ = x;
      __return_storage_ptr__->m_lo = local_80;
      __return_storage_ptr__->m_hi = local_78;
    }
    else {
      frac = (Interval *)tcu::Interval::lo(pIVar1);
      local_98 = &frac_hi_.m_hi;
      dVar7 = deModf((double)frac,(double *)&frac_arg_);
      tcu::Interval::Interval((Interval *)&x_1,dVar7);
      pdVar3 = local_98;
      *local_98 = x_1;
      pdVar3[1] = local_a8;
      pdVar3[2] = local_a0;
      frac_1 = (Interval *)tcu::Interval::hi(pIVar1);
      local_c0 = (undefined8 *)local_70;
      dVar7 = deModf((double)frac_1,(double *)&frac_arg_);
      tcu::Interval::Interval(&local_d8,dVar7);
      puVar2 = local_c0;
      *local_c0 = local_d8._0_8_;
      puVar2[1] = local_d8.m_lo;
      puVar2[2] = local_d8.m_hi;
      tcu::Interval::operator|(&local_f0,(Interval *)&frac_hi_.m_hi,(Interval *)local_70);
      __return_storage_ptr__->m_hasNaN = local_f0.m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_f0._1_7_;
      __return_storage_ptr__->m_lo = local_f0.m_lo;
      __return_storage_ptr__->m_hi = local_f0.m_hi;
    }
    bVar4 = tcu::Interval::hasNaN(pIVar1);
    if (bVar4) {
      fVar6 = std::numeric_limits<float>::quiet_NaN();
      tcu::Interval::Interval((Interval *)&whole_arg_,(double)fVar6);
      tcu::Interval::operator|=(__return_storage_ptr__,(Interval *)&whole_arg_);
    }
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    dVar7 = intPart;
    pIVar1 = *(Interval **)wholeIV;
    tcu::Interval::Interval((Interval *)&whole_hi_.m_hi);
    tcu::Interval::Interval((Interval *)local_148);
    bVar4 = tcu::Interval::empty(pIVar1);
    if (bVar4) {
      tcu::Interval::Interval((Interval *)&x_2);
      *(double *)dVar7 = x_2;
      *(double *)((long)dVar7 + 8) = local_158;
      *(double *)((long)dVar7 + 0x10) = local_150;
    }
    else {
      whole = (Interval *)tcu::Interval::lo(pIVar1);
      local_170 = &whole_hi_.m_hi;
      deModf((double)whole,(double *)&frac_arg_);
      tcu::Interval::Interval((Interval *)&x_3,(double)frac_arg_);
      pdVar3 = local_170;
      *local_170 = x_3;
      pdVar3[1] = local_180;
      pdVar3[2] = local_178;
      whole_1 = (Interval *)tcu::Interval::hi(pIVar1);
      local_198 = (undefined8 *)local_148;
      deModf((double)whole_1,(double *)&frac_arg_);
      tcu::Interval::Interval(&local_1b0,(double)frac_arg_);
      puVar2 = local_198;
      *local_198 = local_1b0._0_8_;
      puVar2[1] = local_1b0.m_lo;
      puVar2[2] = local_1b0.m_hi;
      tcu::Interval::operator|(&local_1c8,(Interval *)&whole_hi_.m_hi,(Interval *)local_148);
      *(undefined8 *)dVar7 = local_1c8._0_8_;
      *(double *)((long)dVar7 + 8) = local_1c8.m_lo;
      *(double *)((long)dVar7 + 0x10) = local_1c8.m_hi;
    }
    bVar4 = tcu::Interval::hasNaN(pIVar1);
    if (bVar4) {
      fVar6 = std::numeric_limits<float>::quiet_NaN();
      tcu::Interval::Interval(&local_1e0,(double)fVar6);
      tcu::Interval::operator|=((Interval *)dVar7,&local_1e0);
    }
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  bVar4 = tcu::Interval::isFinite(*(Interval **)wholeIV);
  if (!bVar4) {
    fVar6 = std::numeric_limits<float>::quiet_NaN();
    tcu::Interval::Interval(&local_1f8,(double)fVar6);
    tcu::Interval::operator|=(__return_storage_ptr__,&local_1f8);
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply				(const EvalContext&, const IArgs& iargs) const
	{
		Interval	fracIV;
		Interval&	wholeIV		= const_cast<Interval&>(iargs.b);
		double		intPart		= 0;

		TCU_INTERVAL_APPLY_MONOTONE1(fracIV, x, iargs.a, frac, frac = deModf(x, &intPart));
		TCU_INTERVAL_APPLY_MONOTONE1(wholeIV, x, iargs.a, whole,
									 deModf(x, &intPart); whole = intPart);

		if (!iargs.a.isFinite())
		{
			// Behavior on modf(Inf) not well-defined, allow anything as a fractional part
			// See Khronos bug 13907
			fracIV |= TCU_NAN;
		}

		return fracIV;
	}